

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

void __thiscall
cppcms::forwarder::remove_forwarding_rule(forwarder *this,shared_ptr<cppcms::mount_point> *p)

{
  unique_lock<booster::shared_mutex> lock;
  unique_lock<booster::shared_mutex> local_20;
  
  std::unique_lock<booster::shared_mutex>::unique_lock(&local_20,&this->mutex_);
  std::
  _Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::erase((_Rb_tree<std::shared_ptr<cppcms::mount_point>,_std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
           *)this,p);
  std::unique_lock<booster::shared_mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void forwarder::remove_forwarding_rule(booster::shared_ptr<mount_point> p)
	{
		booster::unique_lock<booster::shared_mutex> lock(mutex_);
		rules_.erase(p);
	}